

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::test_float_as_integer(void)

{
  undefined4 local_194;
  type_conflict5 local_190 [2];
  undefined1 local_188 [8];
  variable data_5;
  type_conflict5 local_150 [2];
  undefined1 local_148 [8];
  variable data_4;
  type_conflict5 local_110 [2];
  undefined1 local_108 [8];
  variable data_3;
  type_conflict4 local_d0 [2];
  undefined1 local_c8 [8];
  variable data_2;
  type_conflict4 local_90 [2];
  undefined1 local_88 [8];
  variable data_1;
  undefined4 local_50 [4];
  type_conflict4 local_40 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,0.0);
  local_40[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15e5,"void value_suite::test_float_as_integer()",local_40,local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_88,1.0);
  local_90[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                          ((basic_variable<std::allocator<char>_> *)local_88);
  data_2.storage._44_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15e9,"void value_suite::test_float_as_integer()",local_90,&data_2.storage.field_0x2c
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_c8,2.0);
  local_d0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                          ((basic_variable<std::allocator<char>_> *)local_c8);
  data_3.storage._44_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15ed,"void value_suite::test_float_as_integer()",local_d0,&data_3.storage.field_0x2c
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_108,0.0);
  local_110[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                           ((basic_variable<std::allocator<char>_> *)local_108);
  data_4.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","0U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15f1,"void value_suite::test_float_as_integer()",local_110,
             &data_4.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_148,1.0);
  local_150[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  data_5.storage._44_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","1U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15f5,"void value_suite::test_float_as_integer()",local_150,
             &data_5.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_188,2.0);
  local_190[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                           ((basic_variable<std::allocator<char>_> *)local_188);
  local_194 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","2U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15f9,"void value_suite::test_float_as_integer()",local_190,&local_194);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188);
  return;
}

Assistant:

void test_float_as_integer()
{
    {
        variable data(0.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 0);
    }
    {
        variable data(1.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 1);
    }
    {
        variable data(2.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 2);
    }
    {
        variable data(0.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), 0U);
    }
    {
        variable data(1.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), 1U);
    }
    {
        variable data(2.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), 2U);
    }
}